

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O2

void anim_full(Sprite *spr,float *lval,float start_val,float end_val,Interp func,float delay,
              float duration)

{
  float fVar1;
  double dVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  dVar2 = (double)al_get_time();
  fVar6 = (float)((double)delay + dVar2);
  for (lVar3 = 0x48; lVar3 != 0x188; lVar3 = lVar3 + 0x20) {
    if (*(float **)((long)spr->anims + lVar3 + -0x48) == lval) {
      fVar7 = *(float *)((long)spr->anims + lVar3 + -0x30);
      if (fVar6 < fVar7) {
        *(float *)((long)spr->anims + lVar3 + -0x30) = fVar6;
        *(float *)((long)spr->anims + lVar3 + -0x3c) = start_val;
        fVar7 = fVar6;
      }
      fVar1 = *(float *)((long)spr->anims + lVar3 + -0x34);
      if ((fVar6 <= fVar1) || (fVar7 <= fVar1)) {
        *(undefined8 *)((long)spr->anims + lVar3 + -0x48) = 0;
      }
    }
  }
  puVar4 = &get_next_anim_dummy_anim;
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if (lVar5 + 0x20 == 0x160) goto LAB_00103c00;
    lVar3 = lVar5 + 0x20;
  } while (*(long *)((long)&spr->anims[0].lval + lVar5) != 0);
  puVar4 = (undefined8 *)((long)&spr->anims[0].lval + lVar5);
LAB_00103c00:
  *puVar4 = lval;
  *(float *)(puVar4 + 1) = start_val;
  *(float *)((long)puVar4 + 0xc) = end_val;
  *(Interp *)(puVar4 + 2) = func;
  *(float *)((long)puVar4 + 0x14) = fVar6;
  *(float *)(puVar4 + 3) = duration + fVar6;
  return;
}

Assistant:

static void anim_full(Sprite *spr, float *lval, float start_val, float end_val,
   Interp func, float delay, float duration)
{
   float start_time;
   Anim *anim;

   start_time = al_get_time() + delay;
   fix_conflicting_anims(spr, lval, start_time, start_val);

   anim = get_next_anim(spr);
   anim->lval = lval;
   anim->start_val = start_val;
   anim->end_val = end_val;
   anim->func = func;
   anim->start_time = start_time;
   anim->end_time = start_time + duration;
}